

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-future.c
# Opt level: O3

int test(green_loop_t loop)

{
  int extraout_EAX;
  int iVar1;
  green_future_t pgVar2;
  void *pvVar3;
  int iVar4;
  green_loop_t pgVar5;
  green_future_t pgVar6;
  void *__ptr;
  void *p;
  int local_24;
  int *local_20;
  
  iVar4 = 0;
  pgVar2 = green_future_init((green_loop_t)0x0);
  if (pgVar2 == (green_future_t)0x0) {
    pgVar5 = loop;
    pgVar2 = green_future_init(loop);
    iVar4 = (int)pgVar5;
    if (pgVar2 == (green_future_t)0x0) goto LAB_00103da1;
    local_20 = (int *)0x0;
    local_24 = 0;
    iVar4 = 0;
    iVar1 = green_future_result((green_future_t)0x0,&local_20,&local_24);
    if (iVar1 != 1) goto LAB_00103da6;
    if (local_20 != (int *)0x0) goto LAB_00103dab;
    if (local_24 != 0) goto LAB_00103db0;
    iVar4 = 0;
    iVar1 = green_future_set_result((green_future_t)0x0,(void *)0x0,0);
    if (iVar1 != 1) goto LAB_00103db5;
    iVar4 = 0;
    iVar1 = green_future_acquire((green_future_t)0x0);
    if (iVar1 != 1) goto LAB_00103dba;
    iVar4 = 0;
    iVar1 = green_future_release((green_future_t)0x0);
    if (iVar1 != 1) goto LAB_00103dbf;
    pgVar6 = pgVar2;
    iVar1 = green_future_result(pgVar2,&local_20,&local_24);
    iVar4 = (int)pgVar6;
    if (iVar1 != 3) goto LAB_00103dc4;
    iVar4 = 0;
    iVar1 = green_future_done((green_future_t)0x0);
    if (iVar1 == 0) goto LAB_00103dc9;
    pgVar6 = pgVar2;
    iVar1 = green_future_done(pgVar2);
    iVar4 = (int)pgVar6;
    if (iVar1 != 0) goto LAB_00103dce;
    pgVar6 = pgVar2;
    iVar1 = green_future_set_result(pgVar2,&local_24,7);
    iVar4 = (int)pgVar6;
    if (iVar1 != 0) goto LAB_00103dd3;
    pgVar6 = pgVar2;
    iVar1 = green_future_result(pgVar2,&local_20,&local_24);
    iVar4 = (int)pgVar6;
    if (iVar1 != 0) goto LAB_00103dd8;
    if (local_20 != &local_24) goto LAB_00103ddd;
    if (local_24 != 7) goto LAB_00103de2;
    pgVar6 = pgVar2;
    iVar1 = green_future_done(pgVar2);
    iVar4 = (int)pgVar6;
    if (iVar1 == 0) goto LAB_00103de7;
    local_20 = (int *)0x0;
    local_24 = 0;
    pgVar6 = pgVar2;
    iVar1 = green_future_result(pgVar2,&local_20,(int *)0x0);
    iVar4 = (int)pgVar6;
    if (iVar1 != 0) goto LAB_00103dec;
    if (local_20 != &local_24) goto LAB_00103df1;
    if (local_24 != 0) goto LAB_00103df6;
    local_20 = (int *)0x0;
    pgVar6 = pgVar2;
    iVar1 = green_future_result(pgVar2,(void **)0x0,&local_24);
    iVar4 = (int)pgVar6;
    if (iVar1 != 0) goto LAB_00103dfb;
    if (local_20 != (int *)0x0) goto LAB_00103e00;
    if (local_24 != 7) goto LAB_00103e05;
    pgVar6 = pgVar2;
    iVar1 = green_future_set_result(pgVar2,&local_24,7);
    iVar4 = (int)pgVar6;
    if (iVar1 != 8) goto LAB_00103e0a;
    iVar1 = green_future_release(pgVar2);
    iVar4 = (int)pgVar2;
    if (iVar1 != 0) goto LAB_00103e0f;
    pgVar2 = green_future_init(loop);
    iVar4 = (int)loop;
    if (pgVar2 == (green_future_t)0x0) goto LAB_00103e14;
    iVar4 = 0;
    iVar1 = green_future_cancel((green_future_t)0x0);
    if (iVar1 != 1) goto LAB_00103e19;
    local_20 = (int *)0x0;
    local_24 = 0;
    pgVar6 = pgVar2;
    iVar1 = green_future_cancel(pgVar2);
    iVar4 = (int)pgVar6;
    if (iVar1 != 0) goto LAB_00103e1e;
    pgVar6 = pgVar2;
    iVar1 = green_future_result(pgVar2,&local_20,&local_24);
    iVar4 = (int)pgVar6;
    if (iVar1 != 8) goto LAB_00103e23;
    pgVar6 = pgVar2;
    iVar1 = green_future_done(pgVar2);
    iVar4 = (int)pgVar6;
    if (iVar1 == 0) goto LAB_00103e28;
    if (local_20 != (int *)0x0) goto LAB_00103e2d;
    if (local_24 != 0) goto LAB_00103e32;
    pgVar6 = pgVar2;
    iVar1 = green_future_cancel(pgVar2);
    iVar4 = (int)pgVar6;
    if (iVar1 != 8) goto LAB_00103e37;
    pgVar6 = pgVar2;
    iVar1 = green_future_set_result(pgVar2,(void *)0x0,0);
    iVar4 = (int)pgVar6;
    if (iVar1 != 4) goto LAB_00103e3c;
    pgVar6 = pgVar2;
    iVar1 = green_future_done(pgVar2);
    iVar4 = (int)pgVar6;
    if (iVar1 != 0) {
      iVar1 = green_future_release(pgVar2);
      iVar4 = (int)pgVar2;
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00103e46;
    }
  }
  else {
    test_cold_1();
LAB_00103da1:
    test_cold_35();
LAB_00103da6:
    test_cold_2();
LAB_00103dab:
    test_cold_3();
LAB_00103db0:
    test_cold_4();
LAB_00103db5:
    test_cold_5();
LAB_00103dba:
    test_cold_6();
LAB_00103dbf:
    test_cold_7();
LAB_00103dc4:
    test_cold_8();
LAB_00103dc9:
    test_cold_34();
LAB_00103dce:
    test_cold_9();
LAB_00103dd3:
    test_cold_10();
LAB_00103dd8:
    test_cold_11();
LAB_00103ddd:
    test_cold_12();
LAB_00103de2:
    test_cold_13();
LAB_00103de7:
    test_cold_33();
LAB_00103dec:
    test_cold_14();
LAB_00103df1:
    test_cold_15();
LAB_00103df6:
    test_cold_16();
LAB_00103dfb:
    test_cold_17();
LAB_00103e00:
    test_cold_18();
LAB_00103e05:
    test_cold_19();
LAB_00103e0a:
    test_cold_20();
LAB_00103e0f:
    test_cold_21();
LAB_00103e14:
    test_cold_32();
LAB_00103e19:
    test_cold_22();
LAB_00103e1e:
    test_cold_23();
LAB_00103e23:
    test_cold_24();
LAB_00103e28:
    test_cold_31();
LAB_00103e2d:
    test_cold_25();
LAB_00103e32:
    test_cold_26();
LAB_00103e37:
    test_cold_27();
LAB_00103e3c:
    test_cold_28();
  }
  test_cold_30();
LAB_00103e46:
  test_cold_29();
  __ptr = (void *)0x1;
  pvVar3 = calloc(1,(long)iVar4);
  if (pvVar3 != (void *)0x0) {
    return (int)pvVar3;
  }
  green_malloc_cold_1();
  free(__ptr);
  return extraout_EAX;
}

Assistant:

int test(green_loop_t loop)
{
    green_future_t f = NULL;

    // Poller is required.
    f = green_future_init(NULL);
    check_eq(f, NULL);

    // Common case.
    f = green_future_init(loop);
    check_ne(f, NULL);

    void * p = NULL;
    int i = 0;

    // Future is required.
    check_eq(green_future_result(NULL, &p, &i), GREEN_EINVAL);
    check_eq(p, NULL);
    check_eq(i, 0);

    // Future is required.
    check_eq(green_future_set_result(NULL, p, i), GREEN_EINVAL);

    // Future is required.
    check_eq(green_future_acquire(NULL), GREEN_EINVAL);
    check_eq(green_future_release(NULL), GREEN_EINVAL);

    // Check result before completion is not supported.
    check_eq(green_future_result(f, &p, &i), GREEN_EBUSY);

    // Function is NULL-proof.
    check_ne(green_future_done(NULL), 0);

    // Future is not done until set_result is called.
    check_eq(green_future_done(f), 0);

    // Once complete, we should be able to get the result.
    check_eq(green_future_set_result(f, &i, 7), 0);
    check_eq(green_future_result(f, &p, &i), 0);
    check_eq(p, &i);
    check_eq(i, 7);

    // After set_result, future is done.
    check_ne(green_future_done(f), 0);

    // We can get a sub-set of the result.
    p = NULL;
    i = 0;
    check_eq(green_future_result(f, &p, NULL), 0);
    check_eq(p, &i);
    check_eq(i, 0);

    // We can get a sub-set of the result.
    p = NULL;
    i = 0;
    check_eq(green_future_result(f, NULL, &i), 0);
    check_eq(p, NULL);
    check_eq(i, 7);

    // Setting the result again is prohibited.
    check_eq(green_future_set_result(f, &i, 7), GREEN_EBADFD);

    // Let's get us another future.
    check_eq(green_future_release(f), 0); f = NULL;
    f = green_future_init(loop);
    check_ne(f, NULL);

    // Future is required.
    check_eq(green_future_cancel(NULL), GREEN_EINVAL);

    // Once canceled, the future should be done.
    p = NULL;
    i = 0;
    check_eq(green_future_cancel(f), 0);
    check_eq(green_future_result(f, &p, &i), GREEN_EBADFD);
    check_ne(green_future_done(f), 0);
    check_eq(p, NULL);
    check_eq(i, 0);

    // Cannot be canceled twice.
    check_eq(green_future_cancel(f), GREEN_EBADFD);

    // Cannot complete the future after it has been canceled.
    check_eq(green_future_set_result(f, NULL, 0), GREEN_ECANCELED);

    // After set_result, future is done.
    check_ne(green_future_done(f), 0);

    // Done.
    check_eq(green_future_release(f), 0); f = NULL;

    return EXIT_SUCCESS;
}